

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_no_map(void)

{
  basic_variable<std::allocator<char>> *pbVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  basic_variable<std::allocator<char>_> *local_6e8;
  basic_variable<std::allocator<char>_> *local_6d0;
  basic_variable<std::allocator<char>_> *local_6b8;
  basic_variable<std::allocator<char>_> *local_678;
  basic_variable<std::allocator<char>_> *local_660;
  basic_variable<std::allocator<char>_> *local_648;
  basic_variable<std::allocator<char>_> *local_618;
  basic_variable<std::allocator<char>_> *local_600;
  basic_variable<std::allocator<char>_> *local_5d8;
  basic_variable<std::allocator<char>_> *local_5c0;
  undefined4 local_5b4;
  size_type local_5b0;
  undefined1 local_5a7;
  undefined1 local_5a6 [2];
  undefined4 local_5a4;
  size_type local_5a0;
  undefined1 local_597;
  undefined1 local_596 [2];
  undefined4 local_594;
  size_type local_590;
  undefined1 local_584;
  undefined1 local_583 [2];
  undefined1 local_581;
  basic_variable<std::allocator<char>_> *local_580;
  basic_variable<std::allocator<char>_> local_578;
  undefined1 auStack_548 [32];
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> local_4f8;
  undefined1 auStack_4c8 [32];
  basic_variable<std::allocator<char>_> local_4a8;
  basic_variable<std::allocator<char>_> local_478;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  variable data_3;
  size_type local_400;
  undefined1 local_3f7;
  undefined1 local_3f6 [2];
  undefined4 local_3f4;
  size_type local_3f0;
  undefined1 local_3e7;
  undefined1 local_3e6 [2];
  undefined4 local_3e4;
  size_type local_3e0;
  undefined1 local_3d4;
  undefined1 local_3d3 [2];
  undefined1 local_3d1;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 auStack_368 [32];
  basic_variable<std::allocator<char>_> local_348;
  undefined1 auStack_318 [32];
  basic_variable<std::allocator<char>_> local_2f8;
  basic_variable<std::allocator<char>_> local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  variable data_2;
  size_type local_250;
  undefined1 local_247;
  undefined1 local_246 [2];
  undefined4 local_244;
  size_type local_240;
  undefined1 local_234;
  undefined1 local_233 [2];
  undefined1 local_231;
  basic_variable<std::allocator<char>_> *local_230;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 auStack_198 [32];
  basic_variable<std::allocator<char>_> local_178;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  variable data_1;
  size_type local_100;
  undefined1 local_f7;
  undefined1 local_f6 [2];
  undefined4 local_f4;
  size_type local_f0 [2];
  undefined1 local_e0;
  undefined1 local_df [2];
  undefined1 local_dd;
  basic_variable<std::allocator<char>_> *local_d0;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 auStack_98 [32];
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_dd = 1;
  auStack_98._24_8_ = &local_78;
  local_d0 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_d0,"alpha");
  auStack_98._8_8_ = &local_c8;
  auStack_98._16_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_78,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_98 + 8));
  local_dd = 0;
  local_48._0_8_ = &local_78;
  local_48._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_5c0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_5c0 = local_5c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5c0);
  } while (local_5c0 != &local_78);
  local_5d8 = (basic_variable<std::allocator<char>_> *)auStack_98;
  do {
    local_5d8 = local_5d8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5d8);
  } while (local_5d8 != &local_c8);
  local_df[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<trial::dynamic::basic_array<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_e0 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x193,"void ctor_suite::construct_no_map()",local_df,&local_e0);
  local_f0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x194,"void ctor_suite::construct_no_map()",local_f0,&local_f4);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_f6[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_f7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[0].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x195,"void ctor_suite::construct_no_map()",local_f6,&local_f7);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_100 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  data_1.storage._44_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[0].size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x196,"void ctor_suite::construct_no_map()",&local_100,&data_1.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_231 = 1;
  auStack_198._24_8_ = &local_178;
  local_230 = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_230,"alpha");
  local_230 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_230,"hydrogen");
  local_230 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_230,"helium");
  auStack_198._8_8_ = &local_228;
  auStack_198._16_8_ = 3;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_178,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_198 + 8));
  local_231 = 0;
  local_148._0_8_ = &local_178;
  local_148._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_148);
  local_600 = (basic_variable<std::allocator<char>_> *)local_148;
  do {
    local_600 = local_600 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_600);
  } while (local_600 != &local_178);
  local_618 = (basic_variable<std::allocator<char>_> *)auStack_198;
  do {
    local_618 = local_618 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_618);
  } while (local_618 != &local_228);
  local_233[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_138);
  local_234 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x19a,"void ctor_suite::construct_no_map()",local_233,&local_234);
  local_240 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)local_138);
  local_244 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x19b,"void ctor_suite::construct_no_map()",&local_240,&local_244);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_138,0);
  local_246[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_247 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[0].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x19c,"void ctor_suite::construct_no_map()",local_246,&local_247);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_138,0);
  local_250 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  data_2.storage._44_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[0].size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x19d,"void ctor_suite::construct_no_map()",&local_250,&data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  local_3d1 = 1;
  auStack_318._24_8_ = &local_2f8;
  auStack_368._24_8_ = &local_348;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_368._24_8_,"alpha");
  auStack_318._8_8_ = &local_348;
  auStack_318._16_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_2f8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_318 + 8));
  local_3d0 = &local_3c8;
  auStack_318._24_8_ = &local_2c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3d0,"bravo");
  local_3d0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_3d0,"helium");
  auStack_368._8_8_ = &local_3c8;
  auStack_368._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_2c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_368 + 8));
  local_3d1 = 0;
  local_298._0_8_ = &local_2f8;
  local_298._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_298);
  local_648 = (basic_variable<std::allocator<char>_> *)local_298;
  do {
    local_648 = local_648 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_648);
  } while (local_648 != &local_2f8);
  local_660 = (basic_variable<std::allocator<char>_> *)auStack_368;
  do {
    local_660 = local_660 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_660);
  } while (local_660 != &local_3c8);
  local_678 = (basic_variable<std::allocator<char>_> *)auStack_318;
  do {
    local_678 = local_678 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_678);
  } while (local_678 != &local_348);
  local_3d3[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_288);
  local_3d4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a1,"void ctor_suite::construct_no_map()",local_3d3,&local_3d4);
  local_3e0 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)local_288);
  local_3e4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a2,"void ctor_suite::construct_no_map()",&local_3e0,&local_3e4);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_288,0);
  local_3e6[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_3e7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[0].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a3,"void ctor_suite::construct_no_map()",local_3e6,&local_3e7);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_288,0);
  local_3f0 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  local_3f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[0].size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a4,"void ctor_suite::construct_no_map()",&local_3f0,&local_3f4);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_288,1);
  local_3f6[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_3f7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[1].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a5,"void ctor_suite::construct_no_map()",local_3f6,&local_3f7);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_288,1);
  local_400 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  data_3.storage._44_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[1].size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1a6,"void ctor_suite::construct_no_map()",&local_400,&data_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_288);
  local_581 = 1;
  auStack_4c8._24_8_ = &local_4a8;
  auStack_548._24_8_ = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_548._24_8_,"alpha");
  auStack_548._24_8_ = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_548._24_8_,"hydrogen");
  auStack_4c8._8_8_ = &local_528;
  auStack_4c8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_4a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_4c8 + 8));
  local_580 = &local_578;
  auStack_4c8._24_8_ = &local_478;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_580,"bravo");
  auStack_548._8_8_ = &local_578;
  auStack_548._16_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_478,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_548 + 8));
  local_581 = 0;
  local_448._0_8_ = &local_4a8;
  local_448._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_438,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_448);
  local_6b8 = (basic_variable<std::allocator<char>_> *)local_448;
  do {
    local_6b8 = local_6b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_6b8);
  } while (local_6b8 != &local_4a8);
  local_6d0 = (basic_variable<std::allocator<char>_> *)auStack_548;
  do {
    local_6d0 = local_6d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_6d0);
  } while (local_6d0 != &local_578);
  local_6e8 = (basic_variable<std::allocator<char>_> *)auStack_4c8;
  do {
    local_6e8 = local_6e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_6e8);
  } while (local_6e8 != &local_528);
  local_583[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_438);
  local_584 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1aa,"void ctor_suite::construct_no_map()",local_583,&local_584);
  local_590 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)local_438);
  local_594 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1ab,"void ctor_suite::construct_no_map()",&local_590,&local_594);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_438,0);
  local_596[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_597 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[0].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1ac,"void ctor_suite::construct_no_map()",local_596,&local_597);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_438,0);
  local_5a0 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  local_5a4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[0].size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1ad,"void ctor_suite::construct_no_map()",&local_5a0,&local_5a4);
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_438,1);
  local_5a6[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>(pbVar1);
  local_5a7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[1].is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1ae,"void ctor_suite::construct_no_map()",local_5a6,&local_5a7);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_438,1);
  local_5b0 = trial::dynamic::basic_variable<std::allocator<char>_>::size(pbVar2);
  local_5b4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data[1].size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1af,"void ctor_suite::construct_no_map()",&local_5b0,&local_5b4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_438);
  return;
}

Assistant:

void construct_no_map()
{
    {
        variable data({ { "alpha" } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].size(), 1);
    }
    {
        variable data({ { "alpha", "hydrogen", "helium" } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].size(), 3);
    }
    {
        variable data({ { "alpha" }, { "bravo", "helium" } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].size(), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(data[1].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[1].size(), 2);
    }
    {
        variable data({ { "alpha", "hydrogen" }, { "bravo" } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[0].size(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(data[1].is<array>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data[1].size(), 1);
    }
}